

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O0

void libcellml::removeCellml1XNamespaces(XmlNodePtr *node,bool childrenOnly)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  shared_ptr<libcellml::XmlNode> local_110;
  shared_ptr<libcellml::XmlNode> local_100;
  XmlNodePtr local_f0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  iterator local_90;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  const_iterator it;
  undefined1 local_58 [8];
  XmlNamespaceMap definedNamespaces;
  XmlNodePtr tempNode;
  bool childrenOnly_local;
  XmlNodePtr *node_local;
  
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count,node);
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                 &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count
                                 ,(nullptr_t)0x0), bVar1) {
    peVar2 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
    XmlNode::definedNamespaces_abi_cxx11_((XmlNamespaceMap *)local_58,peVar2);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_70);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_58);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_78,&local_80);
    local_70._M_node = local_78._M_node;
    while( true ) {
      local_90._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_58);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_88,&local_90);
      bVar1 = std::operator!=(&local_70,&local_88);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_70);
      bVar1 = std::operator==(&ppVar3->second,"http://www.cellml.org/cellml/1.0#");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"http://www.cellml.org/cellml/1.0#",&local_b1);
        XmlNode::removeNamespaceDefinition(peVar2,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      else {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_70);
        bVar1 = std::operator==(&ppVar3->second,"http://www.cellml.org/cellml/1.1#");
        if (bVar1) {
          peVar2 = std::
                   __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&definedNamespaces._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"http://www.cellml.org/cellml/1.1#",&local_d9);
          XmlNode::removeNamespaceDefinition(peVar2,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_70);
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
    XmlNode::firstChild((XmlNode *)&local_f0);
    removeCellml1XNamespaces(&local_f0,false);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_f0);
    if (childrenOnly) {
      std::shared_ptr<libcellml::XmlNode>::shared_ptr(&local_100,(nullptr_t)0x0);
      std::shared_ptr<libcellml::XmlNode>::operator=
                ((shared_ptr<libcellml::XmlNode> *)
                 &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_100);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_100);
    }
    else {
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
      XmlNode::next((XmlNode *)&local_110);
      std::shared_ptr<libcellml::XmlNode>::operator=
                ((shared_ptr<libcellml::XmlNode> *)
                 &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_110);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_110);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_58);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &definedNamespaces._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void removeCellml1XNamespaces(const XmlNodePtr &node, bool childrenOnly)
{
    auto tempNode = node;
    while (tempNode != nullptr) {
        auto definedNamespaces = tempNode->definedNamespaces();
        XmlNamespaceMap::const_iterator it;
        for (it = definedNamespaces.begin(); it != definedNamespaces.end(); ++it) {
            if (it->second == CELLML_1_0_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_0_NS);
            } else if (it->second == CELLML_1_1_NS) {
                tempNode->removeNamespaceDefinition(CELLML_1_1_NS);
            }
        }

        removeCellml1XNamespaces(tempNode->firstChild());

        if (childrenOnly) {
            tempNode = nullptr;
        } else {
            tempNode = tempNode->next();
        }
    }
}